

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsession.cpp
# Opt level: O1

int __thiscall
jrtplib::RTPSession::SetDefaultTimestampIncrement(RTPSession *this,uint32_t timestampinc)

{
  int iVar1;
  
  iVar1 = -0x3e;
  if ((this->created == true) && (iVar1 = -0x14, (this->packetbuilder).init == true)) {
    (this->packetbuilder).deftsset = true;
    (this->packetbuilder).defaulttimestampinc = timestampinc;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int RTPSession::SetDefaultTimestampIncrement(uint32_t timestampinc)
{
	if (!created)
		return ERR_RTP_SESSION_NOTCREATED;

	int status;

	BUILDER_LOCK
	status = packetbuilder.SetDefaultTimestampIncrement(timestampinc);
	BUILDER_UNLOCK
	return status;
}